

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meld.cpp
# Opt level: O2

bool __thiscall mahjong::Meld::isEdgeWait(Meld *this,Tile last_tile)

{
  bool bVar1;
  IsSame local_10;
  IsTerminal local_f;
  IsSame local_e;
  IsTerminal local_d;
  Tile local_c;
  
  if ((this->is_open == false) && (local_c = last_tile, bVar1 = isTripletOrQuad(this), !bVar1)) {
    bVar1 = IsTerminal::operator()
                      (&local_d,(this->tiles).
                                super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>.
                                _M_impl.super__Vector_impl_data._M_start);
    if ((bVar1) &&
       (bVar1 = IsSame::operator()(&local_e,(this->tiles).
                                            super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>
                                            ._M_impl.super__Vector_impl_data._M_finish + -1,&local_c
                                  ), bVar1)) {
      return true;
    }
    bVar1 = IsTerminal::operator()
                      (&local_f,(this->tiles).
                                super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>.
                                _M_impl.super__Vector_impl_data._M_finish + -1);
    if (bVar1) {
      bVar1 = IsSame::operator()(&local_10,
                                 (this->tiles).
                                 super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>.
                                 _M_impl.super__Vector_impl_data._M_start,&local_c);
      return bVar1;
    }
  }
  return false;
}

Assistant:

bool Meld::isEdgeWait(Tile last_tile) const
{
	if (is_open) return false;
	if (isTripletOrQuad()) return false;

	return (IsTerminal()(tiles.front()) && IsSame()(tiles.back(), last_tile)) ||
		(IsTerminal()(tiles.back()) && IsSame()(tiles.front(), last_tile));
}